

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

void pbrt::ply::parse(string *fileName,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pos,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *nor,
                     vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *tex,
                     vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *idx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pvVar8;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *pvVar9;
  char *__s1;
  bool bVar10;
  int iVar11;
  p_ply ply;
  p_ply_element element;
  p_ply_property ptVar12;
  undefined8 uVar13;
  undefined4 extraout_var_00;
  runtime_error *prVar14;
  byte bVar15;
  size_type __new_size;
  ulong uVar16;
  _Alloc_hider property_name;
  char *pname;
  long instance_count;
  char *name;
  char *local_d0;
  char *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type local_90;
  string *local_88;
  char *local_80;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *local_78;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_70;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_68;
  size_type local_60;
  ulong local_58;
  size_type local_50;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_48;
  p_ply local_40;
  char *local_38;
  undefined4 extraout_var;
  
  local_70 = nor;
  ply = ply_open((fileName->_M_dataplus)._M_p,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ply == (p_ply)0x0) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,"Couldn\'t open PLY file ",fileName);
    std::runtime_error::runtime_error(prVar14,local_b0._M_dataplus._M_p);
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68 = tex;
  local_48 = pos;
  iVar11 = ply_read_header(ply);
  if (iVar11 == 0) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,"Unable to read the header of PLY file ",fileName);
    std::runtime_error::runtime_error(prVar14,local_b0._M_dataplus._M_p);
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c8 = (char *)0x0;
  local_88 = fileName;
  element = ply_get_next_element(ply,(p_ply_element)0x0);
  local_78 = idx;
  if (element == (p_ply_element)0x0) {
    __new_size = 0;
    local_90 = 0;
    bVar5 = false;
    bVar6 = false;
    uVar16 = 0;
    property_name._M_p = (char *)0x0;
    local_80 = (char *)0x0;
  }
  else {
    local_80 = (char *)0x0;
    property_name._M_p = (char *)0x0;
    local_d0 = (char *)0x0;
    local_58 = 0;
    bVar6 = false;
    bVar5 = false;
    local_90 = 0;
    local_60 = 0;
    local_40 = ply;
    do {
      ply_get_element_info(element,&local_38,(long *)&local_50);
      __s1 = local_38;
      iVar11 = strcmp(local_38,"vertex");
      if (iVar11 == 0) {
        local_60 = local_50;
        ptVar12 = ply_get_next_property(element,(p_ply_property)0x0);
        if (ptVar12 == (p_ply_property)0x0) {
          bVar5 = false;
          bVar10 = true;
          bVar6 = false;
        }
        else {
          bVar6 = false;
          bVar10 = false;
          bVar5 = false;
          bVar1 = 0;
          bVar2 = 0;
          bVar3 = 0;
          bVar4 = 0;
          bVar15 = 0;
          do {
            ply_get_property_info
                      (ptVar12,(char **)&local_b0,(e_ply_type *)0x0,(e_ply_type *)0x0,
                       (e_ply_type *)0x0);
            _Var7._M_p = local_b0._M_dataplus._M_p;
            iVar11 = strcmp(local_b0._M_dataplus._M_p,"x");
            if (iVar11 == 0) {
              bVar15 = 1;
            }
            else {
              iVar11 = strcmp(_Var7._M_p,"y");
              if (iVar11 == 0) {
                bVar4 = 1;
              }
              else {
                iVar11 = strcmp(_Var7._M_p,"z");
                if (iVar11 == 0) {
                  bVar3 = 1;
                }
                else {
                  iVar11 = strcmp(_Var7._M_p,"nx");
                  if (iVar11 == 0) {
                    bVar2 = 1;
                  }
                  else {
                    iVar11 = strcmp(_Var7._M_p,"ny");
                    if (iVar11 == 0) {
                      bVar1 = 1;
                    }
                    else {
                      iVar11 = strcmp(_Var7._M_p,"nz");
                      if (iVar11 == 0) {
                        bVar5 = true;
                      }
                      else {
                        iVar11 = strcmp(_Var7._M_p,"u");
                        if ((((iVar11 == 0) || (iVar11 = strcmp(_Var7._M_p,"s"), iVar11 == 0)) ||
                            (iVar11 = strcmp(_Var7._M_p,"texture_u"), iVar11 == 0)) ||
                           (iVar11 = strcmp(_Var7._M_p,"texture_s"), iVar11 == 0)) {
                          local_d0 = _Var7._M_p;
                          bVar10 = true;
                        }
                        else {
                          iVar11 = strcmp(_Var7._M_p,"v");
                          if (((iVar11 == 0) || (iVar11 = strcmp(_Var7._M_p,"t"), iVar11 == 0)) ||
                             ((iVar11 = strcmp(_Var7._M_p,"texture_v"), iVar11 == 0 ||
                              (iVar11 = strcmp(_Var7._M_p,"texture_t"), iVar11 == 0)))) {
                            bVar6 = true;
                            property_name._M_p = _Var7._M_p;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            ptVar12 = ply_get_next_property(element,ptVar12);
          } while (ptVar12 != (p_ply_property)0x0);
          if (!(bool)(bVar2 & bVar1)) {
            bVar5 = false;
          }
          if (!bVar10) {
            bVar6 = false;
          }
          bVar10 = (bool)(bVar15 & bVar4 & bVar3 ^ 1);
          ply = local_40;
        }
        if (bVar10) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_b0,local_88,": Vertex coordinate property not found!");
          std::runtime_error::runtime_error(prVar14,(string *)&local_b0);
          __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        iVar11 = strcmp(__s1,"face");
        if (iVar11 == 0) {
          local_90 = local_50;
          for (ptVar12 = ply_get_next_property(element,(p_ply_property)0x0);
              ptVar12 != (p_ply_property)0x0; ptVar12 = ply_get_next_property(element,ptVar12)) {
            ply_get_property_info
                      (ptVar12,(char **)&local_b0,(e_ply_type *)0x0,(e_ply_type *)0x0,
                       (e_ply_type *)0x0);
            _Var7._M_p = local_b0._M_dataplus._M_p;
            iVar11 = strcmp(local_b0._M_dataplus._M_p,"vertex_index");
            uVar13 = CONCAT44(extraout_var,iVar11);
            if (iVar11 == 0) {
LAB_001346e8:
              local_58 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
              local_80 = _Var7._M_p;
            }
            else {
              iVar11 = strcmp(_Var7._M_p,"vertex_indices");
              uVar13 = CONCAT44(extraout_var_00,iVar11);
              if (iVar11 == 0) goto LAB_001346e8;
            }
          }
        }
      }
      element = ply_get_next_element(ply,element);
    } while (element != (p_ply_element)0x0);
    local_c8 = local_d0;
    __new_size = local_60;
    uVar16 = local_58;
  }
  pvVar8 = local_48;
  pvVar9 = local_68;
  if ((__new_size == 0) || (local_90 == 0)) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,local_88,": PLY file is invalid! No face/vertex elements found!");
    std::runtime_error::runtime_error(prVar14,(string *)&local_b0);
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize(local_48,__new_size);
  if (bVar5) {
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize(local_70,__new_size);
  }
  if (bVar6) {
    std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::resize(pvVar9,__new_size);
  }
  if ((uVar16 & 1) != 0) {
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize(local_78,local_90);
  }
  ply_set_read_cb(ply,"vertex","x",rply_vertex_callback_vec3,
                  (pvVar8->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                  )._M_impl.super__Vector_impl_data._M_start,0);
  ply_set_read_cb(ply,"vertex","y",rply_vertex_callback_vec3,
                  &((pvVar8->
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                    _M_impl.super__Vector_impl_data._M_start)->y,0);
  ply_set_read_cb(ply,"vertex","z",rply_vertex_callback_vec3,
                  &((pvVar8->
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                    _M_impl.super__Vector_impl_data._M_start)->z,0);
  pvVar8 = local_70;
  if (bVar5) {
    ply_set_read_cb(ply,"vertex","nx",rply_vertex_callback_vec3,
                    (local_70->
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                    _M_impl.super__Vector_impl_data._M_start,0);
    ply_set_read_cb(ply,"vertex","ny",rply_vertex_callback_vec3,
                    &((pvVar8->
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                      _M_impl.super__Vector_impl_data._M_start)->y,0);
    ply_set_read_cb(ply,"vertex","nz",rply_vertex_callback_vec3,
                    &((pvVar8->
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                      _M_impl.super__Vector_impl_data._M_start)->z,0);
  }
  pvVar9 = local_68;
  if (bVar6) {
    ply_set_read_cb(ply,"vertex",local_c8,rply_vertex_callback_vec2,
                    (local_68->
                    super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>).
                    _M_impl.super__Vector_impl_data._M_start,0);
    ply_set_read_cb(ply,"vertex",property_name._M_p,rply_vertex_callback_vec2,
                    &((pvVar9->
                      super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>).
                      _M_impl.super__Vector_impl_data._M_start)->y,0);
  }
  if ((uVar16 & 1) != 0) {
    ply_set_read_cb(ply,"face",local_80,rply_face_callback,
                    (local_78->
                    super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>).
                    _M_impl.super__Vector_impl_data._M_start,0);
  }
  iVar11 = ply_read(ply);
  ply_close(ply);
  if (iVar11 != 0) {
    return;
  }
  prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,local_88,": unable to read the contents of PLY file");
  std::runtime_error::runtime_error(prVar14,(string *)&local_b0);
  __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse(const std::string &fileName,
      std::vector<vec3f> &pos,
      std::vector<vec3f> &nor,
      std::vector<vec2f> &tex,
      std::vector<vec3i> &idx)
    {
      p_ply ply = ply_open(fileName.c_str(), nullptr, 0, nullptr);
      if (!ply)
        throw std::runtime_error(std::string("Couldn't open PLY file " + fileName).c_str());

      if (!ply_read_header(ply))
        throw std::runtime_error(std::string("Unable to read the header of PLY file " + fileName).c_str());

      long vertex_count = 0;
      long face_count = 0;
      bool has_normals = false;
      bool has_uvs = false;
      bool has_indices = false;
      const char* tex_coord_u_name = nullptr;
      const char* tex_coord_v_name = nullptr;
      const char* vertex_indices_name = nullptr;

      // Inspect structure of the PLY file.
      p_ply_element element = nullptr;
      while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char* name;
        long instance_count;
        ply_get_element_info(element, &name, &instance_count);

        // Check for vertex element.
        if (strcmp(name, "vertex") == 0) {
          vertex_count = instance_count;

          bool has_position_components[3] = {false};
          bool has_normal_components[3] = {false};
          bool has_uv_components[2] = {false};
         
          // Inspect vertex properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);

            if (!strcmp(pname, "x"))
              has_position_components[0] = true;
            else if (!strcmp(pname, "y"))
              has_position_components[1] = true;
            else if (!strcmp(pname, "z"))
              has_position_components[2] = true;
            else if (!strcmp(pname, "nx"))
              has_normal_components[0] = true;
            else if (!strcmp(pname, "ny"))
              has_normal_components[1] = true;
            else if (!strcmp(pname, "nz"))
              has_normal_components[2] = true;
            else if (!strcmp(pname, "u") || !strcmp(pname, "s") || !strcmp(pname, "texture_u") || !strcmp(pname, "texture_s")) {
              has_uv_components[0] = true;
              tex_coord_u_name = pname;
            }
            else if (!strcmp(pname, "v") || !strcmp(pname, "t") || !strcmp(pname, "texture_v") || !strcmp(pname, "texture_t")) {
              has_uv_components[1] = true;
              tex_coord_v_name = pname;
            }
          }

          if (!(has_position_components[0] && has_position_components[1] && has_position_components[2]))
            throw std::runtime_error(fileName + ": Vertex coordinate property not found!");

          has_normals = has_normal_components[0] && has_normal_components[1] && has_normal_components[2];
          has_uvs = has_uv_components[0] && has_uv_components[1];
        }

        // Check for face element.
        else if (strcmp(name, "face") == 0) {
          face_count = instance_count;

          // Inspect face properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);
            if (!strcmp(pname, "vertex_index") || !strcmp(pname, "vertex_indices")) {
              has_indices = true;
              vertex_indices_name = pname;
            }
          }
        }
      }

      if (vertex_count == 0 || face_count == 0)
        throw std::runtime_error(fileName + ": PLY file is invalid! No face/vertex elements found!");

      pos.resize(vertex_count);
      if (has_normals)
        nor.resize(vertex_count);
      if (has_uvs)
        tex.resize(vertex_count);
      if (has_indices)
        idx.resize(face_count);

      // Set callbacks to process the PLY properties.
      ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback_vec3, &pos[0].x, 0);
      ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback_vec3, &pos[0].y, 0);
      ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback_vec3, &pos[0].z, 0);

      if (has_normals) {
        ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback_vec3, &nor[0].x, 0);
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback_vec3, &nor[0].y, 0);
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback_vec3, &nor[0].z, 0);
      }

      if (has_uvs) {
        ply_set_read_cb(ply, "vertex", tex_coord_u_name, rply_vertex_callback_vec2, &tex[0].x, 0);
        ply_set_read_cb(ply, "vertex", tex_coord_v_name, rply_vertex_callback_vec2, &tex[0].y, 0);
      }

      if (has_indices) {
        ply_set_read_cb(ply, "face", vertex_indices_name, rply_face_callback, &idx[0].x, 0);
      }

      // Read ply file.
      if (!ply_read(ply)) {
        ply_close(ply);
        throw std::runtime_error(fileName + ": unable to read the contents of PLY file");
      }
      ply_close(ply);
    }